

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O3

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeImageCreatePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,ze_device_handle_t hDevice,
          ze_image_desc_t *desc,ze_image_handle_t *phImage)

{
  ze_result_t zVar1;
  
  zVar1 = ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  if ((((hDevice != (ze_device_handle_t)0x0 && hContext != (ze_context_handle_t)0x0) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER,
       phImage != (ze_image_handle_t *)0x0 && desc != (ze_image_desc_t *)0x0)) &&
      (zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION, desc->flags < 4)) && ((int)desc->type < 6)) {
    zVar1 = ParameterValidation::validateExtensions<_ze_image_desc_t_const*>(desc);
    return zVar1;
  }
  return zVar1;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeImageCreatePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device
        const ze_image_desc_t* desc,                    ///< [in] pointer to image descriptor
        ze_image_handle_t* phImage                      ///< [out] pointer to handle of image object created
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == hDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == phImage )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( 0x3 < desc->flags )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( ZE_IMAGE_TYPE_BUFFER < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }